

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_All_Time.cpp
# Opt level: O2

bool __thiscall RenX_Ladder_All_TimePlugin::initialize(RenX_Ladder_All_TimePlugin *this)

{
  LadderDatabase *pLVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined1 *this_00;
  string_view in_key;
  string_view in_key_00;
  
  pLVar1 = &this->database;
  this_00 = &this->field_0x38;
  uVar3 = Jupiter::Config::get(this_00,0xe,"LadderDatabase",9,"Ladder.db");
  Jupiter::Database::process_file(pLVar1,uVar3);
  uVar3 = Jupiter::Config::get(this_00,0xc,"DatabaseName",8,"All-Time");
  RenX::LadderDatabase::setName(pLVar1,uVar3);
  in_key._M_str = "OutputTimes";
  in_key._M_len = 0xb;
  Jupiter::Config::get<bool>((Config *)this_00,in_key,true);
  RenX::LadderDatabase::setOutputTimes(SUB81(pLVar1,0));
  in_key_00._M_str = "ForceDefault";
  in_key_00._M_len = 0xc;
  bVar2 = Jupiter::Config::get<bool>((Config *)this_00,in_key_00,true);
  if (bVar2) {
    RenX::default_ladder_database = pLVar1;
  }
  return true;
}

Assistant:

bool RenX_Ladder_All_TimePlugin::initialize() {
	// Load database
	this->database.process_file(this->config.get("LadderDatabase"sv, "Ladder.db"sv));
	this->database.setName(this->config.get("DatabaseName"sv, "All-Time"sv));
	this->database.setOutputTimes(this->config.get<bool>("OutputTimes"sv, true));

	// Force database to default, if desired
	if (this->config.get<bool>("ForceDefault"sv, true)) {
		RenX::default_ladder_database = &this->database;
	}

	return true;
}